

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polylinecurve.cpp
# Opt level: O1

bool __thiscall ON_PolylineCurve::Extend(ON_PolylineCurve *this,ON_Interval *domain)

{
  long lVar1;
  double *pdVar2;
  ON_3dPoint *pOVar3;
  ON_3dPoint *pOVar4;
  bool bVar5;
  int iVar6;
  long lVar7;
  double dVar8;
  double dVar9;
  ON_3dVector V;
  ON_3dPoint Q0;
  ON_3dVector local_80;
  ON_3dPoint local_68;
  ON_3dVector local_48;
  
  iVar6 = (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x34])();
  if ((char)iVar6 == '\0') {
    iVar6 = ON_Polyline::PointCount(&this->m_pline);
    if ((1 < iVar6) && (bVar5 = ON_Interval::IsIncreasing(domain), bVar5)) {
      (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x25])(this);
      bVar5 = ON_Interval::operator==(domain,(ON_Interval *)&local_80);
      if (bVar5) {
        return true;
      }
      dVar8 = ON_Interval::operator[](domain,0);
      pdVar2 = (this->m_t).m_a;
      dVar9 = *pdVar2;
      bVar5 = dVar8 < dVar9;
      if (dVar8 < dVar9) {
        dVar9 = pdVar2[1] - dVar9;
        if (dVar9 <= 0.0) {
          return false;
        }
        pOVar3 = (this->m_pline).super_ON_3dPointArray.super_ON_SimpleArray<ON_3dPoint>.m_a;
        ON_3dPoint::operator-(&local_80,pOVar3 + 1,pOVar3);
        pOVar3 = (this->m_pline).super_ON_3dPointArray.super_ON_SimpleArray<ON_3dPoint>.m_a;
        local_68.z = pOVar3->z;
        local_68.x = pOVar3->x;
        local_68.y = pOVar3->y;
        dVar8 = ON_Interval::operator[](domain,0);
        ::operator*(&local_48,(dVar8 - *(this->m_t).m_a) / dVar9,&local_80);
        ON_3dPoint::operator+=(&local_68,&local_48);
        dVar9 = ON_Interval::operator[](domain,0);
        *(this->m_t).m_a = dVar9;
        pOVar3 = (this->m_pline).super_ON_3dPointArray.super_ON_SimpleArray<ON_3dPoint>.m_a;
        pOVar3->x = local_68.x;
        pOVar3->y = local_68.y;
        pOVar3->z = local_68.z;
      }
      iVar6 = ON_Polyline::PointCount(&this->m_pline);
      lVar7 = (long)iVar6;
      dVar8 = ON_Interval::operator[](domain,1);
      pdVar2 = (this->m_t).m_a;
      dVar9 = pdVar2[lVar7 + -1];
      if (dVar9 < dVar8) {
        dVar9 = dVar9 - pdVar2[lVar7 + -2];
        if (dVar9 <= 0.0) {
          return false;
        }
        lVar1 = lVar7 + -1;
        pOVar3 = (this->m_pline).super_ON_3dPointArray.super_ON_SimpleArray<ON_3dPoint>.m_a;
        ON_3dPoint::operator-(&local_80,pOVar3 + lVar1,pOVar3 + lVar7 + -2);
        pOVar3 = (this->m_pline).super_ON_3dPointArray.super_ON_SimpleArray<ON_3dPoint>.m_a;
        local_68.z = pOVar3[lVar1].z;
        pOVar3 = pOVar3 + lVar1;
        local_68.x = pOVar3->x;
        local_68.y = pOVar3->y;
        dVar8 = ON_Interval::operator[](domain,1);
        ::operator*(&local_48,(dVar8 - (this->m_t).m_a[lVar1]) / dVar9,&local_80);
        ON_3dPoint::operator+=(&local_68,&local_48);
        dVar9 = ON_Interval::operator[](domain,1);
        (this->m_t).m_a[lVar1] = dVar9;
        pOVar4 = (this->m_pline).super_ON_3dPointArray.super_ON_SimpleArray<ON_3dPoint>.m_a;
        pOVar3 = pOVar4 + lVar1;
        pOVar3->x = local_68.x;
        pOVar3->y = local_68.y;
        pOVar4[lVar1].z = local_68.z;
        bVar5 = true;
      }
      if (bVar5) {
        ON_Curve::DestroyCurveTree(&this->super_ON_Curve);
        return bVar5;
      }
      return bVar5;
    }
  }
  return false;
}

Assistant:

bool ON_PolylineCurve::Extend(
  const ON_Interval& domain
  )

{
  if (IsClosed()) 
    return false;
  if (PointCount() < 2) 
    return false;
  if ( !domain.IsIncreasing() )
    return false;
  bool changed = false;
  if ( domain == Domain() )
    return true;
  
  if (domain[0] < m_t[0]){
    changed = true;
    double len = m_t[1] - m_t[0];
    if ( len <= 0.0 )
      return false;
    ON_3dVector V = m_pline[1] - m_pline[0];
    ON_3dPoint Q0 = m_pline[0];
    Q0 += (domain[0]-m_t[0])/len*V;
    m_t[0] = domain[0];
    m_pline[0] = Q0;
  }

  int last = PointCount()-1;
  if (domain[1] > m_t[last]){
    changed = true;
    double len = m_t[last] - m_t[last-1];
    if ( len <= 0.0 )
      return false;
    ON_3dVector V = m_pline[last] - m_pline[last-1];
    ON_3dPoint Q1 = m_pline[last];
    Q1 += (domain[1]-m_t[last])/len*V;
    m_t[last] = domain[1];
    m_pline[last] = Q1;
  }

  if (changed){
    DestroyCurveTree();
  }
  return changed;
}